

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O1

int av1_rc_regulate_q(AV1_COMP *cpi,int target_bits_per_frame,int active_best_quality,
                     int active_worst_quality,int width,int height)

{
  uint64_t uVar1;
  AQ_MODE AVar2;
  aom_bit_depth_t bit_depth;
  AV1_PRIMARY *pAVar3;
  CYCLIC_REFRESH *pCVar4;
  RefCntBuffer *pRVar5;
  uint64_t uVar6;
  long lVar7;
  long lVar8;
  LAYER_CONTEXT *pLVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  sbyte sVar17;
  uint uVar18;
  bool bVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  double dVar26;
  double qstart;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  iVar12 = av1_get_MBs(width,height);
  dVar26 = get_rate_correction_factor(cpi,width,height);
  uVar23 = 0;
  if ((cpi->oxcf).q_cfg.aq_mode == '\x03') {
    uVar23 = (uint)(cpi->cyclic_refresh->apply_cyclic_refresh != 0);
  }
  iVar15 = (int)((ulong)((long)target_bits_per_frame << 9) / (ulong)(long)iVar12);
  iVar12 = active_best_quality;
  iVar14 = active_worst_quality;
  if (active_best_quality < active_worst_quality) {
    do {
      iVar24 = iVar14 + iVar12 >> 1;
      iVar13 = get_bits_per_mb(cpi,uVar23,dVar26,iVar24);
      if (iVar15 < iVar13) {
        iVar12 = iVar24 + 1;
        iVar24 = iVar14;
      }
      iVar14 = iVar24;
    } while (iVar12 < iVar24);
  }
  iVar14 = get_bits_per_mb(cpi,uVar23,dVar26,iVar12);
  iVar13 = iVar15 - iVar14;
  iVar24 = 0x7fffffff;
  if (iVar15 < iVar14) {
    iVar13 = 0x7fffffff;
  }
  if ((iVar12 != active_best_quality) && (iVar13 != 0x7fffffff)) {
    iVar24 = get_bits_per_mb(cpi,uVar23,dVar26,iVar12 + -1);
    iVar24 = iVar24 - iVar15;
  }
  if (iVar24 < iVar13) {
    iVar12 = iVar12 + -1;
  }
  if ((cpi->oxcf).rc_cfg.mode != AOM_CBR) {
    return iVar12;
  }
  if ((cpi->oxcf).pass != AOM_RC_ONE_PASS) {
    return iVar12;
  }
  if (cpi->ppi->lap_enabled != 0) {
    return iVar12;
  }
  pAVar3 = cpi->ppi;
  iVar14 = (cpi->rc).rc_1_frame;
  if (((iVar14 == -1) && (1000 < (cpi->rc).frame_source_sad)) &&
     ((pAVar3->p_rc).buffer_level < (pAVar3->p_rc).optimal_buffer_level >> 1)) {
    bVar10 = 4 < (cpi->rc).frames_since_key;
  }
  else {
    bVar10 = false;
  }
  uVar23 = 0x14;
  if (bVar10) {
    uVar23 = 0x78;
  }
  iVar15 = (cpi->rc).avg_frame_bandwidth;
  iVar13 = iVar15 - (cpi->rc).prev_avg_frame_bandwidth;
  iVar24 = -iVar13;
  if (0 < iVar13) {
    iVar24 = iVar13;
  }
  AVar2 = (cpi->oxcf).q_cfg.aq_mode;
  if ((AVar2 == '\x03') && (pCVar4 = cpi->cyclic_refresh, pCVar4->apply_cyclic_refresh != 0)) {
    if ((cpi->is_screen_content_type == 0) || (pCVar4->sb_index <= pCVar4->last_sb_index)) {
      sVar17 = 3;
      uVar25 = 0x10;
      uVar18 = 0xffffff80;
      iVar22 = -0x88;
      iVar13 = 0x87;
    }
    else {
      sVar17 = 5;
      uVar25 = 8;
      uVar18 = 0xffffff00;
      iVar22 = -0x120;
      iVar13 = 0x11f;
    }
    uVar21 = (cpi->rc).q_1_frame;
    uVar20 = 1;
    if (iVar13 < (int)uVar21) {
      uVar20 = uVar25;
    }
    uVar25 = uVar21 >> sVar17;
    if (iVar22 + uVar21 < uVar18) {
      uVar25 = uVar20;
    }
    if ((cpi->is_screen_content_type != 0) && (pAVar3->use_svc == 0)) {
      if ((pAVar3->p_rc).optimal_buffer_level < (pAVar3->p_rc).buffer_level) {
        uVar23 = 4;
        if (4 < (int)uVar25) {
          uVar23 = uVar25;
        }
      }
      else if ((!bVar10) && (uVar23 = 8, 8 < (int)uVar25)) {
        uVar23 = uVar25;
      }
    }
  }
  else {
    uVar25 = (cpi->rc).q_1_frame;
    if (cpi->is_screen_content_type == 0) {
      uVar18 = uVar25 - 0x88;
      uVar21 = 1;
      if (0x87 < (int)uVar25) {
        uVar21 = 0x10;
      }
      uVar25 = uVar25 >> 3;
    }
    else {
      uVar18 = uVar25 - 0x90;
      uVar21 = 1;
      if (0x8f < (int)uVar25) {
        uVar21 = 8;
      }
      uVar25 = uVar25 >> 4;
    }
    if (uVar18 < 0xffffff80) {
      uVar25 = uVar21;
    }
  }
  uVar18 = uVar25;
  if (((((cpi->sf).rt_sf.rc_faster_convergence_static == 1) &&
       ((cpi->sf).rt_sf.check_scene_detection != 0)) && ((cpi->rc).frame_source_sad == 0)) &&
     ((cpi->rc).static_since_last_scene_change != 0)) {
    lVar7 = (pAVar3->p_rc).optimal_buffer_level;
    lVar8 = (pAVar3->p_rc).buffer_level;
    if ((lVar7 >> 1 < lVar8 && AVar2 == '\x03') &&
       (4 < cpi->cyclic_refresh->counter_encode_maxq_scene_change)) {
      uVar18 = 0x20;
      if (lVar7 < lVar8) {
        uVar18 = 0x3c;
      }
      uVar23 = 0;
      if (iVar14 == 1) {
        uVar23 = (uint)(lVar8 <= lVar7) << 4 | 0xffffffe0;
      }
      iVar12 = uVar23 + iVar12;
      if ((int)uVar18 < (int)uVar25) {
        uVar18 = uVar25;
      }
      uVar23 = 4;
    }
  }
  pRVar5 = (cpi->common).prev_frame;
  if (pRVar5 == (RefCntBuffer *)0x0) {
    bVar19 = false;
  }
  else {
    bVar19 = true;
    if (pRVar5->width == width) {
      bVar19 = pRVar5->height != height || (double)iVar15 * 0.1 < (double)iVar24;
    }
  }
  if (((((cpi->common).current_frame.frame_type & 0xfd) != 0) &&
      (iVar15 = (cpi->rc).frames_since_key, 1 < iVar15)) &&
     ((iVar24 = (cpi->rc).q_1_frame, 0 < iVar24 && (iVar13 = (cpi->rc).q_2_frame, 0 < iVar13)))) {
    if (pAVar3->use_svc == 0) {
      if (bVar19) goto LAB_002068dd;
    }
    else if ((cpi->svc).current_superframe <= (uint)(cpi->svc).number_temporal_layers || bVar19)
    goto LAB_002068dd;
    if (((cpi->rc).rtc_external_ratectrl == 0) &&
       (((cpi->oxcf).rc_cfg.gf_cbr_boost_pct == 0 ||
        (((cpi->refresh_frame).alt_ref_frame == false &&
         ((cpi->refresh_frame).golden_frame == false)))))) {
      iVar22 = iVar12;
      if ((iVar24 != iVar13 && !bVar10) && (cpi->rc).rc_2_frame * iVar14 == -1) {
        iVar11 = iVar13;
        if (iVar24 < iVar13) {
          iVar11 = iVar24;
        }
        if (iVar13 < iVar24) {
          iVar13 = iVar24;
        }
        if (iVar12 < iVar13) {
          iVar13 = iVar12;
        }
        iVar22 = iVar13;
        if (iVar12 < iVar11) {
          iVar22 = iVar11;
        }
        if (((10 < iVar15) && (iVar14 == -1)) && (iVar22 < iVar12)) {
          iVar22 = iVar22 + iVar12 >> 1;
        }
      }
      if ((((cpi->sf).rt_sf.check_scene_detection != 0) &&
          (uVar6 = (cpi->rc).prev_avg_source_sad, 10 < iVar15 && uVar6 != 0)) &&
         ((cpi->rc).frame_source_sad != 0)) {
        uVar1 = (cpi->rc).avg_source_sad;
        auVar27._8_4_ = (int)(uVar1 >> 0x20);
        auVar27._0_8_ = uVar1;
        auVar27._12_4_ = 0x45300000;
        auVar28._8_4_ = (int)(uVar6 >> 0x20);
        auVar28._0_8_ = uVar6;
        auVar28._12_4_ = 0x45300000;
        dVar26 = ((auVar27._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                 ((auVar28._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) + -1.0;
        if (((0.0 <= dVar26) ||
            ((pAVar3->p_rc).buffer_level <= (pAVar3->p_rc).optimal_buffer_level >> 2)) ||
           (iVar22 <= (cpi->rc).worst_quality >> 1)) {
          if ((iVar22 < iVar24) && (0.1 < dVar26)) {
            lVar7 = (pAVar3->p_rc).optimal_buffer_level;
            lVar8 = (pAVar3->p_rc).maximum_buffer_size;
            lVar16 = lVar7 * 2;
            if (SBORROW8(lVar8,lVar16) != lVar8 + lVar7 * -2 < 0) {
              lVar16 = lVar8;
            }
            if ((pAVar3->p_rc).buffer_level < lVar16) {
              iVar22 = iVar22 * 3 + iVar24 >> 2;
            }
          }
        }
        else {
          bit_depth = ((cpi->common).seq_params)->bit_depth;
          dVar26 = tanh(dVar26 * 4.0);
          qstart = av1_convert_qindex_to_q(iVar22,bit_depth);
          iVar12 = av1_compute_qdelta(&cpi->rc,qstart,(dVar26 * 0.5 + 1.0) * qstart,bit_depth);
          iVar22 = iVar12 + iVar22;
        }
      }
      iVar14 = (cpi->rc).q_1_frame;
      if ((int)uVar18 < iVar14 - iVar22) {
        iVar12 = iVar14 - uVar18;
      }
      else {
        iVar12 = iVar14 + uVar23;
        if (iVar22 - iVar14 <= (int)uVar23) {
          iVar12 = iVar22;
        }
      }
    }
  }
LAB_002068dd:
  iVar14 = (cpi->svc).number_temporal_layers;
  iVar15 = iVar12;
  if ((((1 < iVar14) && ((cpi->svc).spatial_layer_id == 0 && !bVar19)) &&
      ((cpi->rc).rtc_external_ratectrl == 0)) && ((cpi->oxcf).resize_cfg.resize_mode != '\x03')) {
    iVar24 = (cpi->svc).temporal_layer_id;
    if (iVar24 < 1) {
      if (((iVar24 == 0) && (((cpi->common).current_frame.frame_type & 0xfd) != 0)) &&
         (((pAVar3->p_rc).optimal_buffer_level >> 2 < (pAVar3->p_rc).buffer_level &&
          ((cpi->rc).frame_source_sad < 100000)))) {
        iVar15 = iVar12 + -4;
        if (iVar14 != 2) {
          iVar15 = iVar12 + -10;
        }
      }
    }
    else {
      pLVar9 = (cpi->svc).layer_context;
      if (((cpi->rc).avg_frame_bandwidth < (pLVar9->rc).avg_frame_bandwidth) &&
         (iVar15 = (pLVar9->p_rc).last_q[iVar14 <= (cpi->rc).frames_since_key] + -4, iVar15 < iVar12
         )) {
        iVar15 = iVar12;
      }
    }
  }
  if (((cpi->ppi->use_svc == 0) &&
      (pRVar5 = (cpi->common).prev_frame, pRVar5 != (RefCntBuffer *)0x0)) &&
     ((double)pRVar5->height * (double)pRVar5->width * 1.5 < (double)(height * width))) {
    iVar15 = iVar15 + active_worst_quality >> 1;
  }
  if ((cpi->ppi->rtc_ref).bias_recovery_frame == true) {
    iVar14 = av1_svc_get_min_ref_dist(cpi);
    iVar12 = 0x14;
    if (iVar14 < 0x14) {
      iVar12 = iVar14;
    }
    iVar15 = iVar15 - iVar12;
  }
  iVar12 = (cpi->rc).worst_quality;
  iVar14 = (cpi->rc).best_quality;
  if (iVar15 < iVar12) {
    iVar12 = iVar15;
  }
  if (iVar12 <= iVar14) {
    iVar12 = iVar14;
  }
  return iVar12;
}

Assistant:

int av1_rc_regulate_q(const AV1_COMP *cpi, int target_bits_per_frame,
                      int active_best_quality, int active_worst_quality,
                      int width, int height) {
  const int MBs = av1_get_MBs(width, height);
  const double correction_factor =
      get_rate_correction_factor(cpi, width, height);
  const int target_bits_per_mb =
      (int)(((uint64_t)target_bits_per_frame << BPER_MB_NORMBITS) / MBs);

  int q =
      find_closest_qindex_by_rate(target_bits_per_mb, cpi, correction_factor,
                                  active_best_quality, active_worst_quality);
  if (cpi->oxcf.rc_cfg.mode == AOM_CBR && has_no_stats_stage(cpi))
    return adjust_q_cbr(cpi, q, active_worst_quality, width, height);

  return q;
}